

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_blob_open(sqlite3 *db,char *zDb,char *zTable,char *zColumn,sqlite_int64 iRow,int wrFlag,
                     sqlite3_blob **ppBlob)

{
  short sVar1;
  Db *pDVar2;
  Index *pIVar3;
  Schema *pSchema;
  FKey *pFVar4;
  uint p2;
  int iVar5;
  int iVar6;
  Incrblob *p;
  Table *pTVar7;
  Index **ppIVar8;
  Vdbe *p_00;
  VdbeOp *pVVar9;
  Op *pOVar10;
  char *pcVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  char *pcVar15;
  long lVar16;
  long in_FS_OFFSET;
  uint local_220;
  char *local_1e8;
  Parse local_1e0;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_1e8 = (char *)0x0;
  *ppBlob = (sqlite3_blob *)0x0;
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  p2 = (uint)(wrFlag != 0);
  memset(&local_1e0,0xaa,0x1a8);
  p = (Incrblob *)sqlite3DbMallocZero(db,0x38);
  local_220 = 0;
  iVar6 = 0;
  do {
    sqlite3ParseObjectInit(&local_1e0,db);
    if (p == (Incrblob *)0x0) {
LAB_001258fc:
      iVar6 = 0;
      if (db->mallocFailed == '\0') {
        *ppBlob = (sqlite3_blob *)p;
        iVar6 = 0;
      }
      else {
LAB_001259d5:
        if (p != (Incrblob *)0x0) {
LAB_001259da:
          if ((Vdbe *)p->pStmt != (Vdbe *)0x0) {
            sqlite3VdbeFinalize((Vdbe *)p->pStmt);
          }
        }
        sqlite3DbFree(db,p);
      }
      pcVar15 = local_1e8;
      pcVar11 = "%s";
      if (local_1e8 == (char *)0x0) {
        pcVar11 = (char *)0x0;
      }
      sqlite3ErrorWithMsg(db,iVar6,pcVar11,local_1e8);
      sqlite3DbFree(db,pcVar15);
      sqlite3ParseObjectReset(&local_1e0);
      iVar6 = sqlite3ApiExit(db,iVar6);
      if (db->mutex != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return iVar6;
    }
    sqlite3DbFree(db,local_1e8);
    local_1e8 = (char *)0x0;
    sqlite3BtreeEnterAll(db);
    pTVar7 = sqlite3LocateTable(&local_1e0,0,zTable,zDb);
    if (pTVar7 == (Table *)0x0) {
LAB_00125951:
      if (local_1e0.zErrMsg != (char *)0x0) {
        sqlite3DbFree(db,(void *)0x0);
        local_1e8 = local_1e0.zErrMsg;
        local_1e0.zErrMsg = (char *)0x0;
      }
      sqlite3BtreeLeaveAll(db);
      iVar6 = 1;
      goto LAB_001259da;
    }
    if (pTVar7->eTabType == '\x01') {
      pcVar11 = "cannot open virtual table: %s";
LAB_00125940:
      sqlite3ErrorMsg(&local_1e0,pcVar11,zTable);
      goto LAB_00125951;
    }
    if ((char)pTVar7->tabFlags < '\0') {
      pcVar11 = "cannot open table without rowid: %s";
      goto LAB_00125940;
    }
    if ((pTVar7->tabFlags & 0x60) != 0) {
      pcVar11 = "cannot open table with generated columns: %s";
      goto LAB_00125940;
    }
    if (pTVar7->eTabType == '\x02') {
      pcVar11 = "cannot open view: %s";
      goto LAB_00125940;
    }
    p->pTab = pTVar7;
    pDVar2 = db->aDb;
    iVar5 = sqlite3SchemaToIndex(db,pTVar7->pSchema);
    p->zDb = pDVar2[iVar5].zDbSName;
    sVar1 = pTVar7->nCol;
    uVar13 = 0;
    if (0 < sVar1) {
      uVar13 = (ulong)(uint)(int)sVar1;
    }
    lVar16 = 0;
    for (uVar14 = 0; uVar13 != uVar14; uVar14 = uVar14 + 1) {
      iVar5 = sqlite3StrICmp(*(char **)((long)&pTVar7->aCol->zCnName + lVar16),zColumn);
      if (iVar5 == 0) {
        uVar13 = uVar14 & 0xffffffff;
        break;
      }
      lVar16 = lVar16 + 0x10;
    }
    uVar12 = (uint)uVar13;
    if (uVar12 == (int)sVar1) {
      sqlite3DbFree(db,(void *)0x0);
      pcVar11 = "no such column: \"%s\"";
LAB_001259bd:
      local_1e8 = sqlite3MPrintf(db,pcVar11,zColumn);
      sqlite3BtreeLeaveAll(db);
      iVar6 = 1;
      goto LAB_001259d5;
    }
    if (wrFlag != 0) {
      if ((db->flags & 0x4000) == 0) {
        pcVar15 = (char *)0x0;
      }
      else {
        pFVar4 = (FKey *)&pTVar7->u;
        pcVar15 = (char *)0x0;
        while (pFVar4 = pFVar4->pNextFrom, pFVar4 != (FKey *)0x0) {
          uVar14 = (ulong)(uint)pFVar4->nCol;
          if (pFVar4->nCol < 1) {
            uVar14 = 0;
          }
          for (lVar16 = 0; uVar14 * 0x10 != lVar16; lVar16 = lVar16 + 0x10) {
            if (*(uint *)((long)&pFVar4->aCol[0].iFrom + lVar16) == uVar12) {
              pcVar15 = "foreign key";
            }
          }
        }
      }
      ppIVar8 = &pTVar7->pIndex;
      while (pIVar3 = *ppIVar8, pIVar3 != (Index *)0x0) {
        for (uVar14 = 0; pIVar3->nKeyCol != uVar14; uVar14 = uVar14 + 1) {
          if (uVar12 == (int)pIVar3->aiColumn[uVar14]) {
            pcVar15 = "indexed";
          }
          if ((int)pIVar3->aiColumn[uVar14] == 0xfffffffe) {
            pcVar15 = "indexed";
          }
        }
        ppIVar8 = &pIVar3->pNext;
      }
      if (pcVar15 != (char *)0x0) {
        sqlite3DbFree(db,(void *)0x0);
        pcVar11 = "cannot open %s column for writing";
        zColumn = pcVar15;
        goto LAB_001259bd;
      }
    }
    p_00 = sqlite3VdbeCreate(&local_1e0);
    p->pStmt = (sqlite3_stmt *)p_00;
    if (p_00 != (Vdbe *)0x0) {
      pSchema = pTVar7->pSchema;
      iVar5 = sqlite3SchemaToIndex(db,pSchema);
      pOVar10 = (Op *)(ulong)p2;
      sqlite3VdbeAddOp4Int(p_00,2,iVar5,p2,pSchema->schema_cookie,pSchema->iGeneration);
      if (0 < (long)p_00->nOp) {
        pOVar10 = p_00->aOp;
        pOVar10[(long)p_00->nOp + -1].p5 = 1;
      }
      pVVar9 = sqlite3VdbeAddOpList(p_00,6,sqlite3_blob_open::openBlob,(int)pOVar10);
      sqlite3VdbeUsesBtree(p_00,iVar5);
      if (db->mallocFailed == '\0') {
        pVVar9->p1 = iVar5;
        pVVar9->p2 = pTVar7->tnum;
        pVVar9->p3 = p2;
        sqlite3VdbeChangeP4(p_00,2,pTVar7->zName,0);
        if (db->mallocFailed == '\0') {
          if (wrFlag != 0) {
            pVVar9[1].opcode = 'q';
          }
          pVVar9[1].p2 = pTVar7->tnum;
          pVVar9[1].p3 = iVar5;
          pVVar9[1].p4type = -3;
          pVVar9[1].p4.i = pTVar7->nCol + 1;
          pVVar9[3].p2 = (int)pTVar7->nCol;
          local_1e0.nVar = 0;
          local_1e0.nTab = 1;
          local_1e0.nMem = 1;
          sqlite3VdbeMakeReady(p_00,&local_1e0);
        }
      }
    }
    p->iCol = (u16)uVar13;
    p->db = db;
    sqlite3BtreeLeaveAll(db);
    if (((db->mallocFailed != '\0') || (iVar6 = blobSeekToRow(p,iRow,&local_1e8), 0x30 < local_220))
       || (iVar6 != 0x11)) {
      if (iVar6 != 0) goto LAB_001259da;
      goto LAB_001258fc;
    }
    local_220 = local_220 + 1;
    sqlite3ParseObjectReset(&local_1e0);
    iVar6 = 0x11;
  } while( true );
}

Assistant:

SQLITE_API int sqlite3_blob_open(
  sqlite3* db,            /* The database connection */
  const char *zDb,        /* The attached database containing the blob */
  const char *zTable,     /* The table containing the blob */
  const char *zColumn,    /* The column containing the blob */
  sqlite_int64 iRow,      /* The row containing the glob */
  int wrFlag,             /* True -> read/write access, false -> read-only */
  sqlite3_blob **ppBlob   /* Handle for accessing the blob returned here */
){
  int nAttempt = 0;
  int iCol;               /* Index of zColumn in row-record */
  int rc = SQLITE_OK;
  char *zErr = 0;
  Table *pTab;
  Incrblob *pBlob = 0;
  Parse sParse;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( ppBlob==0 ){
    return SQLITE_MISUSE_BKPT;
  }
#endif
  *ppBlob = 0;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) || zTable==0 || zColumn==0 ){
    return SQLITE_MISUSE_BKPT;
  }
#endif
  wrFlag = !!wrFlag;                /* wrFlag = (wrFlag ? 1 : 0); */

  sqlite3_mutex_enter(db->mutex);

  pBlob = (Incrblob *)sqlite3DbMallocZero(db, sizeof(Incrblob));
  while(1){
    sqlite3ParseObjectInit(&sParse,db);
    if( !pBlob ) goto blob_open_out;
    sqlite3DbFree(db, zErr);
    zErr = 0;

    sqlite3BtreeEnterAll(db);
    pTab = sqlite3LocateTable(&sParse, 0, zTable, zDb);
    if( pTab && IsVirtual(pTab) ){
      pTab = 0;
      sqlite3ErrorMsg(&sParse, "cannot open virtual table: %s", zTable);
    }
    if( pTab && !HasRowid(pTab) ){
      pTab = 0;
      sqlite3ErrorMsg(&sParse, "cannot open table without rowid: %s", zTable);
    }
    if( pTab && (pTab->tabFlags&TF_HasGenerated)!=0 ){
      pTab = 0;
      sqlite3ErrorMsg(&sParse, "cannot open table with generated columns: %s",
                      zTable);
    }
#ifndef SQLITE_OMIT_VIEW
    if( pTab && IsView(pTab) ){
      pTab = 0;
      sqlite3ErrorMsg(&sParse, "cannot open view: %s", zTable);
    }
#endif
    if( !pTab ){
      if( sParse.zErrMsg ){
        sqlite3DbFree(db, zErr);
        zErr = sParse.zErrMsg;
        sParse.zErrMsg = 0;
      }
      rc = SQLITE_ERROR;
      sqlite3BtreeLeaveAll(db);
      goto blob_open_out;
    }
    pBlob->pTab = pTab;
    pBlob->zDb = db->aDb[sqlite3SchemaToIndex(db, pTab->pSchema)].zDbSName;

    /* Now search pTab for the exact column. */
    for(iCol=0; iCol<pTab->nCol; iCol++) {
      if( sqlite3StrICmp(pTab->aCol[iCol].zCnName, zColumn)==0 ){
        break;
      }
    }
    if( iCol==pTab->nCol ){
      sqlite3DbFree(db, zErr);
      zErr = sqlite3MPrintf(db, "no such column: \"%s\"", zColumn);
      rc = SQLITE_ERROR;
      sqlite3BtreeLeaveAll(db);
      goto blob_open_out;
    }

    /* If the value is being opened for writing, check that the
    ** column is not indexed, and that it is not part of a foreign key.
    */
    if( wrFlag ){
      const char *zFault = 0;
      Index *pIdx;
#ifndef SQLITE_OMIT_FOREIGN_KEY
      if( db->flags&SQLITE_ForeignKeys ){
        /* Check that the column is not part of an FK child key definition. It
        ** is not necessary to check if it is part of a parent key, as parent
        ** key columns must be indexed. The check below will pick up this
        ** case.  */
        FKey *pFKey;
        assert( IsOrdinaryTable(pTab) );
        for(pFKey=pTab->u.tab.pFKey; pFKey; pFKey=pFKey->pNextFrom){
          int j;
          for(j=0; j<pFKey->nCol; j++){
            if( pFKey->aCol[j].iFrom==iCol ){
              zFault = "foreign key";
            }
          }
        }
      }
#endif
      for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
        int j;
        for(j=0; j<pIdx->nKeyCol; j++){
          /* FIXME: Be smarter about indexes that use expressions */
          if( pIdx->aiColumn[j]==iCol || pIdx->aiColumn[j]==XN_EXPR ){
            zFault = "indexed";
          }
        }
      }
      if( zFault ){
        sqlite3DbFree(db, zErr);
        zErr = sqlite3MPrintf(db, "cannot open %s column for writing", zFault);
        rc = SQLITE_ERROR;
        sqlite3BtreeLeaveAll(db);
        goto blob_open_out;
      }
    }

    pBlob->pStmt = (sqlite3_stmt *)sqlite3VdbeCreate(&sParse);
    assert( pBlob->pStmt || db->mallocFailed );
    if( pBlob->pStmt ){

      /* This VDBE program seeks a btree cursor to the identified
      ** db/table/row entry. The reason for using a vdbe program instead
      ** of writing code to use the b-tree layer directly is that the
      ** vdbe program will take advantage of the various transaction,
      ** locking and error handling infrastructure built into the vdbe.
      **
      ** After seeking the cursor, the vdbe executes an OP_ResultRow.
      ** Code external to the Vdbe then "borrows" the b-tree cursor and
      ** uses it to implement the blob_read(), blob_write() and
      ** blob_bytes() functions.
      **
      ** The sqlite3_blob_close() function finalizes the vdbe program,
      ** which closes the b-tree cursor and (possibly) commits the
      ** transaction.
      */
      static const int iLn = VDBE_OFFSET_LINENO(2);
      static const VdbeOpList openBlob[] = {
        {OP_TableLock,      0, 0, 0},  /* 0: Acquire a read or write lock */
        {OP_OpenRead,       0, 0, 0},  /* 1: Open a cursor */
        /* blobSeekToRow() will initialize r[1] to the desired rowid */
        {OP_NotExists,      0, 5, 1},  /* 2: Seek the cursor to rowid=r[1] */
        {OP_Column,         0, 0, 1},  /* 3  */
        {OP_ResultRow,      1, 0, 0},  /* 4  */
        {OP_Halt,           0, 0, 0},  /* 5  */
      };
      Vdbe *v = (Vdbe *)pBlob->pStmt;
      int iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
      VdbeOp *aOp;

      sqlite3VdbeAddOp4Int(v, OP_Transaction, iDb, wrFlag,
                           pTab->pSchema->schema_cookie,
                           pTab->pSchema->iGeneration);
      sqlite3VdbeChangeP5(v, 1);
      assert( sqlite3VdbeCurrentAddr(v)==2 || db->mallocFailed );
      aOp = sqlite3VdbeAddOpList(v, ArraySize(openBlob), openBlob, iLn);

      /* Make sure a mutex is held on the table to be accessed */
      sqlite3VdbeUsesBtree(v, iDb);

      if( db->mallocFailed==0 ){
        assert( aOp!=0 );
        /* Configure the OP_TableLock instruction */
#ifdef SQLITE_OMIT_SHARED_CACHE
        aOp[0].opcode = OP_Noop;
#else
        aOp[0].p1 = iDb;
        aOp[0].p2 = pTab->tnum;
        aOp[0].p3 = wrFlag;
        sqlite3VdbeChangeP4(v, 2, pTab->zName, P4_TRANSIENT);
      }
      if( db->mallocFailed==0 ){
#endif

        /* Remove either the OP_OpenWrite or OpenRead. Set the P2
        ** parameter of the other to pTab->tnum.  */
        if( wrFlag ) aOp[1].opcode = OP_OpenWrite;
        aOp[1].p2 = pTab->tnum;
        aOp[1].p3 = iDb;

        /* Configure the number of columns. Configure the cursor to
        ** think that the table has one more column than it really
        ** does. An OP_Column to retrieve this imaginary column will
        ** always return an SQL NULL. This is useful because it means
        ** we can invoke OP_Column to fill in the vdbe cursors type
        ** and offset cache without causing any IO.
        */
        aOp[1].p4type = P4_INT32;
        aOp[1].p4.i = pTab->nCol+1;
        aOp[3].p2 = pTab->nCol;

        sParse.nVar = 0;
        sParse.nMem = 1;
        sParse.nTab = 1;
        sqlite3VdbeMakeReady(v, &sParse);
      }
    }

    pBlob->iCol = iCol;
    pBlob->db = db;
    sqlite3BtreeLeaveAll(db);
    if( db->mallocFailed ){
      goto blob_open_out;
    }
    rc = blobSeekToRow(pBlob, iRow, &zErr);
    if( (++nAttempt)>=SQLITE_MAX_SCHEMA_RETRY || rc!=SQLITE_SCHEMA ) break;
    sqlite3ParseObjectReset(&sParse);
  }

blob_open_out:
  if( rc==SQLITE_OK && db->mallocFailed==0 ){
    *ppBlob = (sqlite3_blob *)pBlob;
  }else{
    if( pBlob && pBlob->pStmt ) sqlite3VdbeFinalize((Vdbe *)pBlob->pStmt);
    sqlite3DbFree(db, pBlob);
  }
  sqlite3ErrorWithMsg(db, rc, (zErr ? "%s" : (char*)0), zErr);
  sqlite3DbFree(db, zErr);
  sqlite3ParseObjectReset(&sParse);
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}